

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

void __thiscall
AlignmentRecord::pairWith(AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  AlignmentRecord *pAVar1;
  ShortDnaSequence *pSVar2;
  vector<char,_std::allocator<char>_> *__x;
  string *this_00;
  string *this_01;
  uint uVar3;
  pointer pCVar4;
  pointer pcVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  string *psVar9;
  string *psVar10;
  uint s_1;
  pointer pCVar11;
  AlignmentRecord *pAVar12;
  bool bVar13;
  uint s;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality2;
  string querySequence;
  _Vector_base<int,_std::allocator<int>_> local_2c0;
  _Vector_base<int,_std::allocator<int>_> local_2a8;
  _Vector_base<int,_std::allocator<int>_> local_290;
  _Vector_base<int,_std::allocator<int>_> local_278;
  _Vector_base<char,_std::allocator<char>_> local_260;
  _Vector_base<char,_std::allocator<char>_> local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar7 = *(int *)(alignment + 0xac);
  bVar13 = SUB81(alignment,0);
  if (this->end1 < iVar7 + 1U) {
    this->single_end = false;
    this->start2 = iVar7 + 1U;
    uVar6 = BamTools::BamAlignment::GetEndPosition(bVar13,false);
    this->end2 = uVar6;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
    pAVar1 = (AlignmentRecord *)(alignment + 0x68);
    iVar7 = phred_sum((string *)pAVar1,'!');
    this->phred_sum2 = iVar7;
    pCVar4 = (this->cigar2).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar11 = (this->cigar2).
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar11 != pCVar4; pCVar11 = pCVar11 + 1) {
      for (uVar6 = 0; uVar3 = pCVar11->Length, uVar6 < uVar3; uVar6 = uVar6 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back(&this->cigar2_unrolled,&pCVar11->Type);
      }
      if ((pCVar11->Type == 'D') &&
         (this->length_incl_deletions2 = this->length_incl_deletions2 + uVar3, 1 < uVar3)) {
        this->length_incl_longdeletions2 = this->length_incl_longdeletions2 + uVar3;
      }
    }
    std::__cxx11::string::string((string *)&querySequence,(string *)(alignment + 0x28));
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_248,&this->cigar2_unrolled);
    iVar7 = *(int *)(alignment + 0xac);
    pAVar12 = pAVar1;
    std::__cxx11::string::string((string *)&local_110,(string *)pAVar1);
    referenceString(&ref2,pAVar12,(vector<char,_std::allocator<char>_> *)&local_248,iVar7,
                    &querySequence,&local_110,mainReference);
    std::__cxx11::string::~string((string *)&local_110);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_248);
    ShortDnaSequence::ShortDnaSequence
              ((ShortDnaSequence *)&codesAndQuality2,&querySequence,(string *)pAVar1);
    pSVar2 = &this->sequence2;
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&codesAndQuality2);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&codesAndQuality2);
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    std::vector<int,_std::allocator<int>_>::operator=
              (&this->qualityList2,(vector<int,_std::allocator<int>_> *)&ref2);
    sVar8 = ShortDnaSequence::size(pSVar2);
    this->length_incl_deletions2 = (int)sVar8;
    sVar8 = ShortDnaSequence::size(pSVar2);
    this->length_incl_longdeletions2 = (int)sVar8;
    coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                      *)&codesAndQuality2,this);
  }
  else {
    uVar6 = BamTools::BamAlignment::GetEndPosition(bVar13,false);
    if (this->start1 <= uVar6) {
      getMergedDnaSequence(this,alignment,mainReference);
      goto LAB_0018cfba;
    }
    this->single_end = false;
    this->start2 = this->start1;
    this->end2 = this->end1;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,&this->cigar1);
    pSVar2 = &this->sequence1;
    ShortDnaSequence::operator=(&this->sequence2,pSVar2);
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::vector<int,_std::allocator<int>_>::operator=(&this->qualityList2,&this->qualityList1);
    this->phred_sum2 = this->phred_sum1;
    __x = &this->cigar1_unrolled;
    std::vector<char,_std::allocator<char>_>::operator=(&this->cigar2_unrolled,__x);
    this->length_incl_deletions2 = this->length_incl_deletions1;
    this->length_incl_longdeletions2 = this->length_incl_longdeletions1;
    this->start1 = *(int *)(alignment + 0xac) + 1;
    uVar6 = BamTools::BamAlignment::GetEndPosition(bVar13,false);
    this->end1 = uVar6;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar1,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
    pAVar1 = (AlignmentRecord *)(alignment + 0x68);
    iVar7 = phred_sum((string *)pAVar1,'!');
    this->phred_sum1 = iVar7;
    pcVar5 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar5) {
      (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar5;
    }
    pCVar4 = (this->cigar1).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar11 = (this->cigar1).
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar11 != pCVar4; pCVar11 = pCVar11 + 1) {
      for (uVar6 = 0; uVar3 = pCVar11->Length, uVar6 < uVar3; uVar6 = uVar6 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back(__x,&pCVar11->Type);
      }
      if ((pCVar11->Type == 'D') &&
         (this->length_incl_deletions1 = this->length_incl_deletions1 + uVar3, 1 < uVar3)) {
        this->length_incl_longdeletions1 = this->length_incl_longdeletions1 + uVar3;
      }
    }
    std::__cxx11::string::string((string *)&querySequence,(string *)(alignment + 0x28));
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_260,__x);
    iVar7 = *(int *)(alignment + 0xac);
    pAVar12 = pAVar1;
    std::__cxx11::string::string((string *)&local_130,(string *)pAVar1);
    referenceString(&ref2,pAVar12,(vector<char,_std::allocator<char>_> *)&local_260,iVar7,
                    &querySequence,&local_130,mainReference);
    std::__cxx11::string::~string((string *)&local_130);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_260);
    ShortDnaSequence::ShortDnaSequence
              ((ShortDnaSequence *)&codesAndQuality2,&querySequence,(string *)pAVar1);
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&codesAndQuality2);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&codesAndQuality2);
    std::__cxx11::string::_M_assign((string *)&this->reference_seq1);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence1);
    std::vector<int,_std::allocator<int>_>::operator=
              (&this->qualityList1,(vector<int,_std::allocator<int>_> *)&ref2);
    sVar8 = ShortDnaSequence::size(pSVar2);
    this->length_incl_deletions1 = (int)sVar8;
    sVar8 = ShortDnaSequence::size(pSVar2);
    this->length_incl_longdeletions1 = (int)sVar8;
    coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                      *)&codesAndQuality2,this);
  }
  std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::_M_move_assign
            (&this->cov_pos,
             (_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
             &codesAndQuality2);
  std::_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
  ~_Vector_base((_Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                 *)&codesAndQuality2);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ::~_Tuple_impl(&ref2.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                );
  std::__cxx11::string::~string((string *)&querySequence);
LAB_0018cfba:
  if (this->strand1 == true) {
    std::__cxx11::string::string((string *)&local_150,(string *)&this->reference_seq1);
    std::__cxx11::string::string((string *)&local_170,(string *)&this->alignSequence1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_278,&this->qualityList1);
    CTandCTOTReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ref2,&local_150,&local_170,
                       (vector<int,_std::allocator<int>_> *)&local_278,'G','C','T');
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_278);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::_M_assign((string *)&this->code1);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality1);
    std::__cxx11::string::string((string *)&local_190,(string *)&this->reference_seq2);
    std::__cxx11::string::string((string *)&local_1b0,(string *)&this->alignSequence2);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_290,&this->qualityList2);
    CTandCTOTReadCoder(&codesAndQuality2,&local_190,&local_1b0,
                       (vector<int,_std::allocator<int>_> *)&local_290,'G','C','T');
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_290);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality2);
  }
  else {
    pSVar2 = &this->sequence1;
    psVar9 = ShortDnaSequence::toString_abi_cxx11_(pSVar2);
    std::__cxx11::string::string((string *)&local_50,(string *)psVar9);
    complement((string *)&codesAndQuality2,&local_50);
    psVar9 = ShortDnaSequence::qualityString_abi_cxx11_(pSVar2);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)&ref2,(string *)&codesAndQuality2,psVar9)
    ;
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&ref2);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&ref2);
    std::__cxx11::string::~string((string *)&codesAndQuality2);
    std::__cxx11::string::~string((string *)&local_50);
    psVar9 = &this->reference_seq1;
    std::__cxx11::string::string((string *)&local_70,(string *)psVar9);
    complement((string *)&ref2,&local_70);
    std::__cxx11::string::operator=((string *)psVar9,(string *)&ref2);
    std::__cxx11::string::~string((string *)&ref2);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &this->alignSequence1;
    std::__cxx11::string::string((string *)&local_90,(string *)this_00);
    complement((string *)&ref2,&local_90);
    std::__cxx11::string::operator=((string *)this_00,(string *)&ref2);
    std::__cxx11::string::~string((string *)&ref2);
    std::__cxx11::string::~string((string *)&local_90);
    pSVar2 = &this->sequence2;
    psVar10 = ShortDnaSequence::toString_abi_cxx11_(pSVar2);
    std::__cxx11::string::string((string *)&local_b0,(string *)psVar10);
    complement((string *)&codesAndQuality2,&local_b0);
    psVar10 = ShortDnaSequence::qualityString_abi_cxx11_(pSVar2);
    ShortDnaSequence::ShortDnaSequence
              ((ShortDnaSequence *)&ref2,(string *)&codesAndQuality2,psVar10);
    ShortDnaSequence::operator=(pSVar2,(ShortDnaSequence *)&ref2);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)&ref2);
    std::__cxx11::string::~string((string *)&codesAndQuality2);
    std::__cxx11::string::~string((string *)&local_b0);
    psVar10 = &this->reference_seq2;
    std::__cxx11::string::string((string *)&local_d0,(string *)psVar10);
    complement((string *)&ref2,&local_d0);
    std::__cxx11::string::operator=((string *)psVar10,(string *)&ref2);
    std::__cxx11::string::~string((string *)&ref2);
    std::__cxx11::string::~string((string *)&local_d0);
    this_01 = &this->alignSequence2;
    std::__cxx11::string::string((string *)&local_f0,(string *)this_01);
    complement((string *)&ref2,&local_f0);
    std::__cxx11::string::operator=((string *)this_01,(string *)&ref2);
    std::__cxx11::string::~string((string *)&ref2);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_1d0,(string *)psVar9);
    std::__cxx11::string::string((string *)&local_1f0,(string *)this_00);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_2a8,&this->qualityList1);
    OBandCTOBReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&ref2,&local_1d0,&local_1f0,
                       (vector<int,_std::allocator<int>_> *)&local_2a8,'G','C','T');
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2a8);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::_M_assign((string *)&this->code1);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality1);
    std::__cxx11::string::string((string *)&local_210,(string *)psVar10);
    std::__cxx11::string::string((string *)&local_230,(string *)this_01);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_2c0,&this->qualityList2);
    OBandCTOBReadCoder(&codesAndQuality2,&local_210,&local_230,
                       (vector<int,_std::allocator<int>_> *)&local_2c0,'G','C','T');
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2c0);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&codesAndQuality2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ref2);
  return;
}

Assistant:

void AlignmentRecord::pairWith(const BamTools::BamAlignment& alignment, string &mainReference) {

    if ((unsigned)(alignment.Position+1) > this->end1) {
        this->single_end = false;
        this->start2 = alignment.Position + 1;
        this->end2 = alignment.GetEndPosition();
        if (!(this->end2 > 0)){
            //cout << this->name << " end: " << this->end2 << endl;
        }
        this->cigar2 = alignment.CigarData;

        this->phred_sum2 = phred_sum(alignment.Qualities);


        for (const auto& it : cigar2) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar2_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions2+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions2+=it.Length;
                }
            }
        }
        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref2 = referenceString(this->getCigar2Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence2 = ShortDnaSequence(querySequence, alignment.Qualities);

        this->reference_seq2=std::get<0>(ref2);
        this->alignSequence2=std::get<1>(ref2);
        this->qualityList2 = std::get<2>(ref2);

        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        //End NoMe Additions
        this->cov_pos = this->coveredPositions();

    } else if ((unsigned)alignment.GetEndPosition() < this->start1) {
        this->single_end = false;
        this->start2 = this->start1;
        this->end2 = this->end1;
        this->cigar2 = this->cigar1;
        this->sequence2 = this->sequence1;
        this->reference_seq2 = this->reference_seq1;
        this->alignSequence2 = this->alignSequence1;
        this->code2 = this->code1;
        this->qualityList2 = this->qualityList1;
        this->phred_sum2 = this->phred_sum1;
        this->cigar2_unrolled = this->cigar1_unrolled;
        this->length_incl_deletions2 = this->length_incl_deletions1;
        this->length_incl_longdeletions2 = this->length_incl_longdeletions1;

        this->start1 = alignment.Position + 1;
        this->end1 = alignment.GetEndPosition();
        this->cigar1 = alignment.CigarData;

        this->phred_sum1 = phred_sum(alignment.Qualities);

        this->cigar1_unrolled.clear();
        for (const auto& it : cigar1) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar1_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions1+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions1+=it.Length;
                }
            }
        }

        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref3 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);
        this->reference_seq1 = std::get<0>(ref3);
        this->alignSequence1 = std::get<1>(ref3);
        this->qualityList1 = std::get<2>(ref3);

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();

        //End NoMe Additions
        this->cov_pos = this->coveredPositions();
        if(this->reference_seq1.size()-1!=this->cigar1_unrolled.size()){
            assert(false);
        }
    }//merging of overlapping paired ends to single end reads
    else {
        this->getMergedDnaSequence(alignment,mainReference);
    }

    //Reverse Complementing the pair 1 and two based on which strand they come from
    if(this->isStrand1()){
            //OT and CTOT reads, no need to complement these reads as they are already in the forward direction
            std::vector<string> codesAndQuality1 = CTandCTOTReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = CTandCTOTReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }else if(!this->strand1){
            //OB and CTOB reads. We need to complement these reads since we want the original reverse strand reads
            this->sequence1 = ShortDnaSequence(complement(this->sequence1.toString()), this->sequence1.qualityString());
            this->reference_seq1 = complement(this->reference_seq1);
            this->alignSequence1 = complement(this->alignSequence1);
            this->sequence2 = ShortDnaSequence(complement(this->sequence2.toString()), this->sequence2.qualityString());
            this->reference_seq2 = complement(this->reference_seq2);
            this->alignSequence2 = complement(this->alignSequence2);
            vector<string> codesAndQuality1 = OBandCTOBReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = OBandCTOBReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }
}